

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

int ws_listener_set(void *arg,char *name,void *buf,size_t sz,nni_type t)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  
  iVar1 = nni_setopt(ws_listener_options,name,arg,buf,sz,t);
  if (iVar1 == 9) {
    iVar1 = nni_http_server_set(*(nni_http_server **)((long)arg + 0x50),name,buf,sz,t);
    if (iVar1 == 9) {
      iVar2 = strncmp(name,"ws:header:",10);
      iVar1 = 9;
      if ((iVar2 == 0) && (iVar1 = 0x1e, t == NNI_TYPE_STRING)) {
        sVar3 = nni_strnlen((char *)buf,sz);
        iVar1 = 3;
        if (sVar3 < sz) {
          nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
          iVar1 = ws_set_header((nni_list *)((long)arg + 0x130),name + 10,(char *)buf);
          nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
        }
      }
    }
  }
  return iVar1;
}

Assistant:

static int
ws_listener_set(
    void *arg, const char *name, const void *buf, size_t sz, nni_type t)
{
	nni_ws_listener *l = arg;
	int              rv;

	rv = nni_setopt(ws_listener_options, name, l, buf, sz, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_http_server_set(l->server, name, buf, sz, t);
	}

	if (rv == NNG_ENOTSUP) {
		if (startswith(name, NNG_OPT_WS_HEADER)) {
			rv = ws_listener_set_header(l, name, buf, sz, t);
		}
	}
	return (rv);
}